

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  long lVar1;
  ImVec2 IVar2;
  float local_50;
  float local_4c;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 content_max;
  ImGuiContext *g;
  float default_y_local;
  float default_x_local;
  ImVec2 size_local;
  
  content_max = (ImVec2)GImGui;
  ImVec2::ImVec2(&local_30);
  default_y_local = size.x;
  default_x_local = size.y;
  if ((default_y_local < 0.0) || (default_x_local < 0.0)) {
    lVar1 = *(long *)((long)content_max + 0x1768);
    local_40 = GetContentRegionMax();
    local_38 = ::operator+((ImVec2 *)(lVar1 + 0x1c),&local_40);
    local_30 = local_38;
  }
  IVar2 = size;
  if (default_y_local <= 0.0) {
    if ((default_y_local != 0.0) || (local_4c = default_x, NAN(default_y_local))) {
      local_4c = ImMax(local_30.x - *(float *)(*(long *)((long)content_max + 0x1768) + 0xc0),4.0);
      local_4c = local_4c + default_y_local;
    }
    default_y_local = local_4c;
    IVar2 = _default_y_local;
  }
  _default_y_local = IVar2;
  if (default_x_local <= 0.0) {
    if ((default_x_local != 0.0) || (local_50 = default_y, NAN(default_x_local))) {
      local_50 = ImMax(local_30.y - *(float *)(*(long *)((long)content_max + 0x1768) + 0xc4),4.0);
      local_50 = local_50 + default_x_local;
    }
    default_x_local = local_50;
  }
  return _default_y_local;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}